

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseBlockDeclaration(WastParser *this,BlockDeclaration *decl)

{
  Var *this_00;
  Result RVar1;
  Enum EVar2;
  FuncDeclaration func_decl;
  FuncDeclaration local_120;
  
  this_00 = &local_120.type_var;
  local_120.has_func_type = false;
  Var::Var(this_00);
  local_120.sig.param_type_names._M_h._M_buckets =
       &local_120.sig.param_type_names._M_h._M_single_bucket;
  local_120.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.sig.param_type_names._M_h._M_bucket_count = 1;
  local_120.sig.param_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120.sig.param_type_names._M_h._M_element_count = 0;
  local_120.sig.param_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_120.sig.param_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  local_120.sig.param_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_120.sig.result_type_names._M_h._M_buckets =
       &local_120.sig.result_type_names._M_h._M_single_bucket;
  local_120.sig.result_type_names._M_h._M_bucket_count = 1;
  local_120.sig.result_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120.sig.result_type_names._M_h._M_element_count = 0;
  local_120.sig.result_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_120.sig.result_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  local_120.sig.result_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  RVar1 = ParseTypeUseOpt(this,&local_120);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseUnboundFuncSignature(this,&local_120.sig);
    if (RVar1.enum_ != Error) {
      decl->has_func_type = local_120.has_func_type;
      Var::operator=(&decl->type_var,this_00);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(decl->sig).param_types,&local_120.sig.param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(decl->sig).result_types,&local_120.sig.result_types);
      EVar2 = Ok;
      if (&local_120 != decl) {
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(decl->sig).param_type_names,&local_120.sig.param_type_names._M_h);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(decl->sig).result_type_names,&local_120.sig.result_type_names._M_h);
        EVar2 = Ok;
      }
    }
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_120.sig.result_type_names._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_120.sig.param_type_names._M_h);
  if (local_120.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.sig.param_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.sig.param_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.sig.param_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Var::~Var(this_00);
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseBlockDeclaration(BlockDeclaration* decl) {
  WABT_TRACE(ParseBlockDeclaration);
  FuncDeclaration func_decl;
  CHECK_RESULT(ParseTypeUseOpt(&func_decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&func_decl.sig));
  decl->has_func_type = func_decl.has_func_type;
  decl->type_var = func_decl.type_var;
  decl->sig = func_decl.sig;
  return Result::Ok;
}